

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media-adv.c
# Opt level: O0

la_proto_node * la_media_adv_parse(char *txt)

{
  _Bool _Var1;
  undefined1 *puVar2;
  size_t sVar3;
  ushort **ppuVar4;
  la_vstring *plVar5;
  char *pcVar6;
  char *in_RDI;
  size_t i;
  la_proto_node *node;
  la_media_adv_msg *msg;
  size_t in_stack_00000030;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 uVar7;
  void *buffer;
  char *local_10;
  la_proto_node *local_8;
  
  if (in_RDI == (char *)0x0) {
    local_8 = (la_proto_node *)0x0;
  }
  else {
    puVar2 = (undefined1 *)la_xcalloc(in_stack_00000030,(size_t)txt,&msg->err,node._4_4_,(char *)i);
    *puVar2 = 1;
    local_8 = la_proto_node_new();
    local_8->data = puVar2;
    local_8->td = &la_DEF_media_adv_message;
    local_8->next = (la_proto_node *)0x0;
    sVar3 = strlen(in_RDI);
    if (((9 < sVar3) && (puVar2[1] = *in_RDI + -0x30, puVar2[1] == '\0')) &&
       ((puVar2[5] = in_RDI[1], puVar2[5] == 'E' || (puVar2[5] == 'L')))) {
      puVar2[6] = in_RDI[2];
      _Var1 = is_valid_link('\0');
      if (_Var1) {
        for (buffer = (void *)0x3; buffer < (void *)0x9; buffer = (void *)((long)buffer + 1)) {
          ppuVar4 = __ctype_b_loc();
          if (((*ppuVar4)[(int)in_RDI[(long)buffer]] & 0x800) == 0) {
            return local_8;
          }
        }
        puVar2[2] = (in_RDI[3] + -0x30) * '\n' + in_RDI[4] + -0x30;
        puVar2[3] = (in_RDI[5] + -0x30) * '\n' + in_RDI[6] + -0x30;
        puVar2[4] = (in_RDI[7] + -0x30) * '\n' + in_RDI[8] + -0x30;
        if ((((byte)puVar2[2] < 0x18) && ((byte)puVar2[3] < 0x3c)) && ((byte)puVar2[4] < 0x3c)) {
          local_10 = in_RDI + 9;
          plVar5 = la_vstring_new();
          *(la_vstring **)(puVar2 + 8) = plVar5;
          while( true ) {
            uVar7 = false;
            if (*local_10 != '/') {
              uVar7 = *local_10 != '\0';
            }
            if ((bool)uVar7 == false) break;
            _Var1 = is_valid_link('\0');
            if (!_Var1) {
              return local_8;
            }
            la_vstring_append_buffer
                      ((la_vstring *)local_8,buffer,CONCAT17(uVar7,in_stack_ffffffffffffffd0));
            local_10 = local_10 + 1;
          }
          if ((*local_10 == '/') && (local_10[1] != '\0')) {
            pcVar6 = strdup(local_10 + 1);
            *(char **)(puVar2 + 0x10) = pcVar6;
          }
          *puVar2 = 0;
        }
      }
    }
  }
  return local_8;
}

Assistant:

la_proto_node *la_media_adv_parse(char const *txt) {
	if(txt == NULL) {
		return NULL;
	}

	LA_NEW(la_media_adv_msg, msg);
	msg->err = true;

	la_proto_node *node = la_proto_node_new();
	node->data = msg;
	node->td = &la_DEF_media_adv_message;
	node->next = NULL;

	if(strlen(txt) < 10) {
		goto end;
	}
	msg->version = txt[0] - '0';
	if(msg->version != 0) {
		goto end;
	}
	msg->state = txt[1];
	if(msg->state != 'E' && msg->state != 'L') {
		goto end;
	}
	msg->current_link = txt[2];
	if(!is_valid_link(msg->current_link)) {
		goto end;
	}
	for(size_t i = 3; i < 9; i++) {
		if(!isdigit(txt[i])) {
			goto end;
		}
	}
	msg->hour = ATOI2(txt[3], txt[4]);
	msg->minute = ATOI2(txt[5], txt[6]);
	msg->second = ATOI2(txt[7], txt[8]);
	if(msg->hour > 23 || msg->minute > 59 || msg->second > 59) {
		goto end;
	}
	txt += 9;
	msg->available_links = la_vstring_new();
	// Copy all link until / character or end of string
	for(; *txt != '/' && *txt != '\0'; txt++) {
		if(is_valid_link(*txt)) {
			la_vstring_append_buffer(msg->available_links, txt, 1);
		} else {
			goto end;
		}
	}
	if(txt[0] == '/' && txt[1] != '\0') {
		msg->text = strdup(txt + 1);
	}
	msg->err = false;
end:
	return node;
}